

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

TypeNames * __thiscall
wasm::DefaultTypeNameGenerator::getNames
          (TypeNames *__return_storage_ptr__,DefaultTypeNameGenerator *this,HeapType type)

{
  __node_base_ptr *pp_Var1;
  HeapTypeKind HVar2;
  ostream *poVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>,_bool>
  pVar4;
  uintptr_t local_230;
  stringstream stream;
  ostream local_220 [8];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_218 [6];
  TypeNames local_a8;
  string local_58;
  HeapType local_38;
  HeapType type_local;
  
  pp_Var1 = &local_a8.fieldNames._M_h._M_single_bucket;
  local_a8.name.super_IString.str._M_len = 0;
  local_a8.name.super_IString.str._M_str = (char *)0x0;
  local_a8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.fieldNames._M_h._M_element_count = 0;
  local_a8.fieldNames._M_h._M_bucket_count = 1;
  local_a8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
  local_a8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_230 = type.id;
  local_a8.fieldNames._M_h._M_buckets = pp_Var1;
  local_38.id = type.id;
  TypeNames::TypeNames((TypeNames *)&stream,&local_a8);
  pVar4 = std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->nameCache,&local_230);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(local_218);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a8.fieldNames._M_h);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00cfb544;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
  HVar2 = HeapType::getKind(&local_38);
  switch(HVar2) {
  case Basic:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x57e);
  case Func:
    poVar3 = std::operator<<(local_220,"func.");
    break;
  case Struct:
    poVar3 = std::operator<<(local_220,"struct.");
    this = (DefaultTypeNameGenerator *)&this->structCount;
    break;
  case Array:
    poVar3 = std::operator<<(local_220,"array.");
    this = (DefaultTypeNameGenerator *)&this->arrayCount;
    break;
  case Cont:
    poVar3 = std::operator<<(local_220,"cont.");
    this = (DefaultTypeNameGenerator *)&this->contCount;
    break;
  default:
    goto switchD_00cfb459_default;
  }
  this->funcCount = this->funcCount + 1;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
switchD_00cfb459_default:
  std::__cxx11::stringbuf::str();
  IString::IString((IString *)&local_a8,&local_58);
  local_a8.fieldNames._M_h._M_bucket_count = 1;
  local_a8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.fieldNames._M_h._M_element_count = 0;
  local_a8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
  local_a8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.fieldNames._M_h._M_buckets = pp_Var1;
  TypeNames::operator=
            ((TypeNames *)
             ((long)pVar4.first.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
             + 0x10),&local_a8);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a8.fieldNames._M_h);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
LAB_00cfb544:
  TypeNames::TypeNames
            (__return_storage_ptr__,
             (TypeNames *)
             ((long)pVar4.first.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
             + 0x10));
  return __return_storage_ptr__;
}

Assistant:

TypeNames DefaultTypeNameGenerator::getNames(HeapType type) {
  auto [it, inserted] = nameCache.insert({type, {}});
  if (inserted) {
    // Generate a new name for this type we have not previously seen.
    std::stringstream stream;
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        stream << "func." << funcCount++;
        break;
      case HeapTypeKind::Struct:
        stream << "struct." << structCount++;
        break;
      case HeapTypeKind::Array:
        stream << "array." << arrayCount++;
        break;
      case HeapTypeKind::Cont:
        stream << "cont." << contCount++;
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
    it->second = {stream.str(), {}};
  }
  return it->second;
}